

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O3

void __thiscall MidiPlayerDialog::startPlayingFiles(MidiPlayerDialog *this,QStringList *fileList)

{
  QArrayData *pQVar1;
  uint uVar2;
  int iVar3;
  QForeachContainer<QList<QString>_> _container_292;
  QString local_88;
  QArrayDataPointer<QString> local_70;
  QString *local_58;
  QString *local_50;
  undefined4 local_48;
  QArrayDataPointer<QString> local_40;
  
  QListWidget::clear();
  local_70.d = (fileList->d).d;
  local_58 = (fileList->d).ptr;
  local_70.size = (fileList->d).size;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50 = local_58 + local_70.size;
  local_48 = 1;
  local_70.ptr = local_58;
  if (local_70.size != 0) {
    do {
      pQVar1 = &((local_58->d).d)->super_QArrayData;
      local_88.d.ptr = (local_58->d).ptr;
      local_88.d.size = (local_58->d).size;
      if (pQVar1 == (QArrayData *)0x0) {
        iVar3 = (int)*(undefined8 *)(this->ui + 0x18);
        local_88.d.d = (Data *)0x0;
      }
      else {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        iVar3 = (int)*(undefined8 *)(this->ui + 0x18);
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_88.d.d = (Data *)pQVar1;
      }
      Master::parseMidiListFromPathName((QStringList *)&local_40,&local_88);
      uVar2 = QListWidget::count();
      QListWidget::insertItems(iVar3,(QList *)(ulong)uVar2);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
        }
      }
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
      local_58 = local_58 + 1;
    } while (local_58 != local_50);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  updateCurrentItem(this);
  on_playButton_clicked(this);
  return;
}

Assistant:

void MidiPlayerDialog::startPlayingFiles(const QStringList &fileList) {
	ui->playList->clear();
	foreach (QString fileName, fileList) {
		ui->playList->addItems(Master::parseMidiListFromPathName(fileName));
	}
	updateCurrentItem();
	on_playButton_clicked();
}